

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O2

bool Gudhi::persistence_matrix::operator==
               (Unordered_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
                *c1,Unordered_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>
                    *c2)

{
  const_iterator cVar1;
  __node_base *p_Var2;
  bool bVar3;
  Entry *entry;
  key_type local_28;
  
  if (c1 == c2) {
    bVar3 = true;
  }
  else if ((c1->column_)._M_h._M_element_count == (c2->column_)._M_h._M_element_count) {
    p_Var2 = &(c1->column_)._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      bVar3 = p_Var2 == (__node_base *)0x0;
      if (bVar3) {
        return bVar3;
      }
      local_28 = *(key_type *)(p_Var2 + 1);
      cVar1 = std::
              _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(c2->column_)._M_h,&local_28);
    } while (cVar1.
             super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_false,_false>_>_>_*,_true>
             ._M_cur != (__node_type *)0x0);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const Unordered_set_column& c1, const Unordered_set_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    for (Entry* entry : c1.column_) {
      auto it = c2.column_.find(entry);
      if (it == c2.column_.end()) return false;
      if constexpr (!Master_matrix::Option_list::is_z2)
        if ((*it)->get_element() != entry->get_element()) return false;
    }
    return true;
  }